

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChPhysicsItem.cpp
# Opt level: O3

void __thiscall
chrono::ChPhysicsItem::AddVisualModel(ChPhysicsItem *this,shared_ptr<chrono::ChVisualModel> *model)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  ChVisualModelInstance *pCVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  shared_ptr<chrono::ChVisualModel> local_48;
  ChVisualModelInstance *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  
  local_38 = (ChVisualModelInstance *)::operator_new(0x18);
  local_48.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (model->super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_48.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (model->super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  p_Var1 = (model->super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  ChVisualModelInstance::ChVisualModelInstance(local_38,&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChVisualModelInstance*>
            (a_Stack_30,local_38);
  _Var3._M_pi = a_Stack_30[0]._M_pi;
  pCVar2 = local_38;
  local_38 = (ChVisualModelInstance *)0x0;
  a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->vis_model_instance).
           super___shared_ptr<chrono::ChVisualModelInstance,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  (this->vis_model_instance).
  super___shared_ptr<chrono::ChVisualModelInstance,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pCVar2;
  (this->vis_model_instance).
  super___shared_ptr<chrono::ChVisualModelInstance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    if (a_Stack_30[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_30[0]._M_pi);
    }
  }
  if (local_48.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  ((this->vis_model_instance).
   super___shared_ptr<chrono::ChVisualModelInstance,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_owner =
       this;
  return;
}

Assistant:

void ChPhysicsItem::AddVisualModel(std::shared_ptr<ChVisualModel> model) {
    vis_model_instance = std::shared_ptr<ChVisualModelInstance>(new ChVisualModelInstance(model));
    vis_model_instance->m_owner = this;
}